

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::SignTransaction
          (CWallet *this,CMutableTransaction *tx,
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *coins,int sighash,
          map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
          *input_errors)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  reference ppSVar4;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  CWallet *in_RDI;
  undefined8 in_R8;
  long in_FS_OFFSET;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  undefined4 in_stack_ffffffffffffff64;
  _Self *in_stack_ffffffffffffff68;
  int local_84;
  byte local_49;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetAllScriptPubKeyMans(in_RDI);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *)CONCAT44(in_stack_ffffffffffffff64,
                      CONCAT13(in_stack_ffffffffffffff63,
                               CONCAT12(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60))));
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
         *)CONCAT44(in_stack_ffffffffffffff64,
                    CONCAT13(in_stack_ffffffffffffff63,
                             CONCAT12(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60))));
  do {
    bVar2 = std::operator==(in_stack_ffffffffffffff68,
                            (_Self *)CONCAT44(in_stack_ffffffffffffff64,
                                              CONCAT13(in_stack_ffffffffffffff63,
                                                       CONCAT12(in_stack_ffffffffffffff62,
                                                                in_stack_ffffffffffffff60))));
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_84 = 2;
LAB_0170a1a1:
      std::
      set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~set(in_stack_ffffffffffffff58);
      if (local_84 != 1) {
        local_49 = 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (bool)(local_49 & 1);
      }
      __stack_chk_fail();
    }
    ppSVar4 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         in_stack_ffffffffffffff58);
    uVar3 = (*(*ppSVar4)->_vptr_ScriptPubKeyMan[0x17])(*ppSVar4,in_RSI,in_RDX,(ulong)in_ECX,in_R8);
    in_stack_ffffffffffffff63 = (undefined1)uVar3;
    if ((uVar3 & 1) != 0) {
      local_49 = 1;
      local_84 = 1;
      goto LAB_0170a1a1;
    }
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffff58);
  } while( true );
}

Assistant:

bool CWallet::SignTransaction(CMutableTransaction& tx, const std::map<COutPoint, Coin>& coins, int sighash, std::map<int, bilingual_str>& input_errors) const
{
    // Try to sign with all ScriptPubKeyMans
    for (ScriptPubKeyMan* spk_man : GetAllScriptPubKeyMans()) {
        // spk_man->SignTransaction will return true if the transaction is complete,
        // so we can exit early and return true if that happens
        if (spk_man->SignTransaction(tx, coins, sighash, input_errors)) {
            return true;
        }
    }

    // At this point, one input was not fully signed otherwise we would have exited already
    return false;
}